

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtprandomurandom.cpp
# Opt level: O0

int __thiscall jrtplib::RTPRandomURandom::Init(RTPRandomURandom *this)

{
  FILE *pFVar1;
  RTPRandomURandom *this_local;
  
  if (this->device == (FILE *)0x0) {
    pFVar1 = fopen("/dev/urandom","rb");
    this->device = (FILE *)pFVar1;
    if (this->device == (FILE *)0x0) {
      this_local._4_4_ = -0x88;
    }
    else {
      this_local._4_4_ = 0;
    }
  }
  else {
    this_local._4_4_ = -0x89;
  }
  return this_local._4_4_;
}

Assistant:

int RTPRandomURandom::Init()
{
	if (device)
		return ERR_RTP_RTPRANDOMURANDOM_ALREADYOPEN;

	device = fopen("/dev/urandom","rb");
	if (device == 0)
		return ERR_RTP_RTPRANDOMURANDOM_CANTOPEN;

	return 0;
}